

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cortex.cpp
# Opt level: O0

int Initialize_ListenForReplies(void)

{
  int iVar1;
  int status;
  unsigned_short in_stack_00000016;
  unsigned_long in_stack_00000018;
  int local_4;
  
  if (CommandSocket == -1) {
    LogMessage(4,"Creating Socket for commands");
    CommandSocket = Socket_CreateForBroadcasting(in_stack_00000018,in_stack_00000016);
    if (CommandSocket == -1) {
      LogMessage(1,"Unable to initialize SDK Sockets.");
      local_4 = 3;
    }
    else {
      iVar1 = pthread_create(&CortexListenThread_ID,(pthread_attr_t *)0x0,CortexListenThread_Func,
                             (void *)0x0);
      if (iVar1 != 0) {
        LogMessage(1,"%s: pthread_create error starting CortexListenThread thread",
                   "int Initialize_ListenForReplies()");
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LOCAL int Initialize_ListenForReplies()
{
  if (CommandSocket != -1) {
    return OK;
  }
  LogMessage(VL_Debug, "Creating Socket for commands");
  CommandSocket
      = Socket_CreateForBroadcasting(MyNicCardAddress.s_addr, wMyPort);

  if (CommandSocket == -1) {
    LogMessage(VL_Error, "Unable to initialize SDK Sockets.");
    return RC_NetworkError;
  }

  int status = pthread_create(&CortexListenThread_ID, NULL,
                              CortexListenThread_Func, NULL);
  if (status != 0) {
    LogMessage(VL_Error,
               "%s: pthread_create error starting CortexListenThread thread",
               __PRETTY_FUNCTION__);
  }

  return OK;
}